

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LineOffsetCache.cpp
# Opt level: O3

charcount_t __thiscall
Js::LineOffsetCache::GetCharacterOffsetForLine
          (LineOffsetCache *this,charcount_t line,charcount_t *outByteOffset)

{
  charcount_t cVar1;
  ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer> *this_00;
  code *pcVar2;
  bool bVar3;
  uint32 uVar4;
  charcount_t cVar5;
  undefined4 *puVar6;
  uint *puVar7;
  
  uVar4 = GetLineCount(this);
  if (uVar4 <= line) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/LineOffsetCache.cpp"
                                ,0x6d,"(line < this->GetLineCount())",
                                "Invalid line value passed in.");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  puVar7 = JsUtil::ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer>::Item
                     ((this->lineCharacterOffsetCacheList).ptr,line);
  cVar1 = *puVar7;
  if (outByteOffset != (charcount_t *)0x0) {
    this_00 = (this->lineByteOffsetCacheList).ptr;
    cVar5 = cVar1;
    if (this_00 != (ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer> *)0x0) {
      puVar7 = JsUtil::ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer>::Item
                         (this_00,line);
      cVar5 = *puVar7;
    }
    *outByteOffset = cVar5;
  }
  return cVar1;
}

Assistant:

charcount_t LineOffsetCache::GetCharacterOffsetForLine(charcount_t line, charcount_t *outByteOffset) const
    {
        AssertMsg(line < this->GetLineCount(), "Invalid line value passed in.");

        charcount_t characterOffset = this->lineCharacterOffsetCacheList->Item(line);

        if (outByteOffset != nullptr)
        {            
            *outByteOffset = this->lineByteOffsetCacheList? this->lineByteOffsetCacheList->Item(line) : characterOffset;            
        }

        return characterOffset;
    }